

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImGuiWindow *pIVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ImGuiWindowSettings *pIVar8;
  
  uVar6 = (ctx->Windows).Size;
  uVar5 = (ulong)uVar6;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      if ((long)(int)uVar5 <= (long)uVar7) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar1 = (ctx->Windows).Data[uVar7];
      if ((pIVar1->Flags & 0x100) == 0) {
        uVar6 = pIVar1->SettingsOffset;
        if ((ulong)uVar6 == 0xffffffff) {
          pIVar8 = ImGui::FindWindowSettings(pIVar1->ID);
        }
        else {
          if (((int)uVar6 < 4) || ((ctx->SettingsWindows).Buf.Size <= (int)uVar6)) {
            __assert_fail("off >= 4 && off < Buf.Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui_internal.h"
                          ,0x21b,
                          "T *ImChunkStream<ImGuiWindowSettings>::ptr_from_offset(int) [T = ImGuiWindowSettings]"
                         );
          }
          pIVar8 = (ImGuiWindowSettings *)((ctx->SettingsWindows).Buf.Data + uVar6);
        }
        if (pIVar8 == (ImGuiWindowSettings *)0x0) {
          pIVar8 = ImGui::CreateNewWindowSettings(pIVar1->Name);
          iVar3 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(&ctx->SettingsWindows,pIVar8);
          pIVar1->SettingsOffset = iVar3;
        }
        if (pIVar8->ID != pIVar1->ID) {
          __assert_fail("settings->ID == window->ID",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2a8b,
                        "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
        pIVar8->Pos = (ImVec2ih)
                      ((int)((pIVar1->Pos).x - (pIVar1->ViewportPos).x) & 0xffffU |
                      (int)((pIVar1->Pos).y - (pIVar1->ViewportPos).y) << 0x10);
        pIVar8->Size = (ImVec2ih)
                       ((int)(pIVar1->SizeFull).x & 0xffffU | (int)(pIVar1->SizeFull).y << 0x10);
        pIVar8->ViewportId = pIVar1->ViewportId;
        pIVar8->ViewportPos =
             (ImVec2ih)
             ((int)(pIVar1->ViewportPos).x & 0xffffU | (int)(pIVar1->ViewportPos).y << 0x10);
        if ((pIVar1->DockNode != (ImGuiDockNode *)0x0) && (pIVar1->DockNode->ID != pIVar1->DockId))
        {
          __assert_fail("window->DockNode == __null || window->DockNode->ID == window->DockId",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2a90,
                        "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
        pIVar8->DockId = pIVar1->DockId;
        pIVar8->ClassId = (pIVar1->WindowClass).ClassId;
        pIVar8->DockOrder = pIVar1->DockOrder;
        pIVar8->Collapsed = pIVar1->Collapsed;
      }
      uVar7 = uVar7 + 1;
      uVar5 = (ulong)(uint)(ctx->Windows).Size;
    } while (uVar7 != uVar5);
  }
  iVar3 = (buf->Buf).Size;
  iVar4 = iVar3 + -1;
  if (iVar3 == 0) {
    iVar4 = 0;
  }
  ImGuiTextBuffer::reserve(buf,iVar4 + (ctx->SettingsWindows).Buf.Size * 6);
  pcVar2 = (ctx->SettingsWindows).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar8 = (ImGuiWindowSettings *)(pcVar2 + 4);
    do {
      ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pIVar8 + 1);
      if ((pIVar8->ViewportId != 0) && (pIVar8->ViewportId != 0x11111111)) {
        ImGuiTextBuffer::appendf
                  (buf,"ViewportPos=%d,%d\n",(ulong)(uint)(int)(pIVar8->ViewportPos).x,
                   (ulong)(uint)(int)(pIVar8->ViewportPos).y);
        ImGuiTextBuffer::appendf(buf,"ViewportId=0x%08X\n",(ulong)pIVar8->ViewportId);
      }
      uVar6 = (uint)(pIVar8->Pos).x;
      if (((uVar6 != 0) || ((pIVar8->Pos).y != 0)) || (pIVar8->ViewportId == 0x11111111)) {
        ImGuiTextBuffer::appendf(buf,"Pos=%d,%d\n",(ulong)uVar6,(ulong)(uint)(int)(pIVar8->Pos).y);
      }
      uVar6 = (uint)(pIVar8->Size).x;
      if ((uVar6 != 0) || ((pIVar8->Size).y != 0)) {
        ImGuiTextBuffer::appendf(buf,"Size=%d,%d\n",(ulong)uVar6,(ulong)(uint)(int)(pIVar8->Size).y)
        ;
      }
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pIVar8->Collapsed);
      if (pIVar8->DockId != 0) {
        if (pIVar8->DockOrder == -1) {
          ImGuiTextBuffer::appendf(buf,"DockId=0x%08X\n");
        }
        else {
          ImGuiTextBuffer::appendf(buf,"DockId=0x%08X,%d\n");
        }
        if (pIVar8->ClassId != 0) {
          ImGuiTextBuffer::appendf(buf,"ClassId=0x%08X\n");
        }
      }
      ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      pIVar8 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar8);
    } while (pIVar8 != (ImGuiWindowSettings *)0x0);
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih(window->Pos - window->ViewportPos);
        settings->Size = ImVec2ih(window->SizeFull);
        settings->ViewportId = window->ViewportId;
        settings->ViewportPos = ImVec2ih(window->ViewportPos);
        IM_ASSERT(window->DockNode == NULL || window->DockNode->ID == window->DockId);
        settings->DockId = window->DockId;
        settings->ClassId = window->WindowClass.ClassId;
        settings->DockOrder = window->DockOrder;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        if (settings->ViewportId != 0 && settings->ViewportId != ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
        {
            buf->appendf("ViewportPos=%d,%d\n", settings->ViewportPos.x, settings->ViewportPos.y);
            buf->appendf("ViewportId=0x%08X\n", settings->ViewportId);
        }
        if (settings->Pos.x != 0 || settings->Pos.y != 0 || settings->ViewportId == ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
            buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        if (settings->Size.x != 0 || settings->Size.y != 0)
            buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        if (settings->DockId != 0)
        {
            // Write DockId as 4 digits if possible. Automatic DockId are small numbers, but full explicit DockSpace() are full ImGuiID range.
            if (settings->DockOrder == -1)
                buf->appendf("DockId=0x%08X\n", settings->DockId);
            else
                buf->appendf("DockId=0x%08X,%d\n", settings->DockId, settings->DockOrder);
            if (settings->ClassId != 0)
                buf->appendf("ClassId=0x%08X\n", settings->ClassId);
        }
        buf->append("\n");
    }
}